

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O3

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
::EndObject(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
            *this,SizeType memberCount)

{
  Stack<rapidjson::CrtAllocator> *this_00;
  char *pcVar1;
  
  pcVar1 = (this->level_stack_).stackTop_;
  if ((ulong)((long)pcVar1 - (long)(this->level_stack_).stack_) < 0x10) {
    __assert_fail("level_stack_.GetSize() >= sizeof(Level)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ntrrgc[P]pulse-volume-monitor/vendor/rapidjson/writer.h"
                  ,0x90,
                  "bool rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<>>>::EndObject(SizeType) [OutputStream = rapidjson::GenericStringBuffer<rapidjson::UTF8<>>, SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator]"
                 );
  }
  if (pcVar1[-8] != '\x01') {
    (this->level_stack_).stackTop_ = pcVar1 + -0x10;
    this_00 = &this->os_->stack_;
    pcVar1 = this_00->stackTop_;
    if (this_00->stackEnd_ <= pcVar1 + 1) {
      internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,1);
      pcVar1 = this_00->stackTop_;
    }
    this_00->stackTop_ = pcVar1 + 1;
    *pcVar1 = '}';
    return true;
  }
  __assert_fail("!level_stack_.template Top<Level>()->inArray",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ntrrgc[P]pulse-volume-monitor/vendor/rapidjson/writer.h"
                ,0x91,
                "bool rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<>>>::EndObject(SizeType) [OutputStream = rapidjson::GenericStringBuffer<rapidjson::UTF8<>>, SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator]"
               );
}

Assistant:

bool String(const std::basic_string<Ch>& str) {
        return String(str.data(), SizeType(str.size()));
    }